

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *outpubkey,
                      ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  ptls_iovec_t *ppVar1;
  uint8_t *puVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_70;
  size_t local_68;
  uint8_t *local_50;
  size_t local_48;
  int local_3c;
  ptls_key_exchange_context_t *ppStack_38;
  int ret;
  ptls_key_exchange_context_t *ctx;
  ptls_iovec_t *secret_local;
  ptls_iovec_t *outpubkey_local;
  ptls_key_exchange_algorithm_t *algo_local;
  ptls_iovec_t peerkey_local;
  
  peerkey_local.base = (uint8_t *)peerkey.len;
  algo_local = (ptls_key_exchange_algorithm_t *)peerkey.base;
  ppStack_38 = (ptls_key_exchange_context_t *)0x0;
  ctx = (ptls_key_exchange_context_t *)secret;
  secret_local = outpubkey;
  outpubkey_local = (ptls_iovec_t *)algo;
  pVar3 = ptls_iovec_init((void *)0x0,0);
  local_50 = pVar3.base;
  outpubkey->base = local_50;
  local_48 = pVar3.len;
  outpubkey->len = local_48;
  local_3c = evp_keyex_create((ptls_key_exchange_algorithm_t *)outpubkey_local,
                              &stack0xffffffffffffffc8);
  if (local_3c == 0) {
    puVar2 = (uint8_t *)malloc((ppStack_38->pubkey).len);
    secret_local->base = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      local_3c = 0x201;
    }
    else {
      memcpy(secret_local->base,(ppStack_38->pubkey).base,(ppStack_38->pubkey).len);
      secret_local->len = (ppStack_38->pubkey).len;
      pVar3.len = (size_t)peerkey_local.base;
      pVar3.base = (uint8_t *)algo_local;
      local_3c = evp_keyex_on_exchange(&stack0xffffffffffffffc8,1,(ptls_iovec_t *)ctx,pVar3);
      if (ppStack_38 != (ptls_key_exchange_context_t *)0x0) {
        __assert_fail("ctx == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                      ,0x2ba,
                      "int evp_keyex_exchange(ptls_key_exchange_algorithm_t *, ptls_iovec_t *, ptls_iovec_t *, ptls_iovec_t)"
                     );
      }
    }
  }
  if (ppStack_38 != (ptls_key_exchange_context_t *)0x0) {
    pVar3 = ptls_iovec_init((void *)0x0,0);
    evp_keyex_on_exchange(&stack0xffffffffffffffc8,1,(ptls_iovec_t *)0x0,pVar3);
  }
  if (local_3c != 0) {
    free(secret_local->base);
    ppVar1 = secret_local;
    pVar3 = ptls_iovec_init((void *)0x0,0);
    local_70 = pVar3.base;
    ppVar1->base = local_70;
    local_68 = pVar3.len;
    ppVar1->len = local_68;
  }
  return local_3c;
}

Assistant:

static int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *outpubkey, ptls_iovec_t *secret,
                              ptls_iovec_t peerkey)
{
    ptls_key_exchange_context_t *ctx = NULL;
    int ret;

    *outpubkey = ptls_iovec_init(NULL, 0);

    if ((ret = evp_keyex_create(algo, &ctx)) != 0)
        goto Exit;
    if ((outpubkey->base = malloc(ctx->pubkey.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(outpubkey->base, ctx->pubkey.base, ctx->pubkey.len);
    outpubkey->len = ctx->pubkey.len;
    ret = evp_keyex_on_exchange(&ctx, 1, secret, peerkey);
    assert(ctx == NULL);

Exit:
    if (ctx != NULL)
        evp_keyex_on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    if (ret != 0) {
        free(outpubkey->base);
        *outpubkey = ptls_iovec_init(NULL, 0);
    }
    return ret;
}